

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O2

char ** CmdDupArgv(int argc,char **argv)

{
  char *__s;
  char **ppcVar1;
  size_t sVar2;
  char *__dest;
  ulong uVar3;
  ulong uVar4;
  
  ppcVar1 = (char **)malloc((long)argc * 8);
  uVar3 = 0;
  uVar4 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    __s = argv[uVar3];
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar2 = strlen(__s);
      __dest = (char *)malloc(sVar2 + 1);
      strcpy(__dest,__s);
    }
    ppcVar1[uVar3] = __dest;
  }
  return ppcVar1;
}

Assistant:

char ** CmdDupArgv( int argc, char **argv )
{
    char ** argvNew = ABC_ALLOC( char *, argc );
    int i;
    for ( i = 0; i < argc; i++ )
        argvNew[i] = Abc_UtilStrsav( argv[i] );
    return argvNew;
}